

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O2

mcu8str * mctools_path_join(mcu8str *__return_storage_ptr__,mcu8str *p1raw,mcu8str *p2raw)

{
  ulong uVar1;
  char *pcVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  mcu8str *str;
  long lVar7;
  ulong uVar8;
  ulong __n;
  mcu8str_size_t prealloc_size;
  mcu8str p2;
  mcu8str p1;
  mcu8str local_60;
  mcu8str local_48;
  
  mctools_impl_view_no_winnamespace(&local_48,p1raw);
  mctools_impl_view_no_winnamespace(&local_60,p2raw);
  __n = (ulong)local_48.size;
  if ((ulong)local_60.size == 0) {
    if (__n == 0) {
      __return_storage_ptr__->c_str = mcu8str_create_empty::dummy;
      __return_storage_ptr__->size = 0;
      __return_storage_ptr__->buflen = 0;
      __return_storage_ptr__->owns_memory = 0;
      return __return_storage_ptr__;
    }
    if ((local_48.c_str[local_48.size - 1] != '\\') && (local_48.c_str[local_48.size - 1] != '/')) {
      mcu8str_create(__return_storage_ptr__,(ulong)(local_48.size + 1));
      mcu8str_append(__return_storage_ptr__,&local_48);
      pcVar2 = __return_storage_ptr__->c_str;
      uVar6 = __return_storage_ptr__->size;
      pcVar2[uVar6] = '/';
      uVar6 = uVar6 + 1;
      __return_storage_ptr__->size = uVar6;
      pcVar2[uVar6] = '\0';
      goto LAB_00107d9f;
    }
    str = &local_48;
  }
  else {
    if (local_48.size < 2) {
      cVar3 = '\0';
    }
    else {
      cVar3 = mctools_drive_letter(&local_48);
    }
    if (local_60.size == 1) {
      cVar4 = '\0';
    }
    else {
      cVar4 = mctools_drive_letter(&local_60);
    }
    if ((__n == 0) || (iVar5 = mctools_path_is_absolute(&local_60), iVar5 != 0)) {
      if (cVar4 == '\0' && cVar3 != '\0') {
        mcu8str_create(__return_storage_ptr__,(ulong)(local_60.size + 2));
        pcVar2 = __return_storage_ptr__->c_str;
        *pcVar2 = cVar3;
        pcVar2[1] = ':';
        pcVar2[2] = '\0';
        __return_storage_ptr__->size = 2;
        mcu8str_append(__return_storage_ptr__,&local_60);
        goto LAB_00107d9f;
      }
    }
    else if (cVar3 == cVar4 || cVar4 == '\0') {
      uVar1 = (ulong)(cVar3 != '\0') * 2 + 1;
      lVar7 = 0;
      if (cVar3 != '\0') {
        lVar7 = (ulong)(cVar3 != cVar4) * 2 + -2;
      }
      uVar8 = __n;
      if (uVar1 < __n) {
        uVar8 = uVar1;
      }
      for (; uVar1 < __n; __n = __n - 1) {
        cVar3 = local_48.c_str[__n - 1];
        if (((cVar3 != '\\') && (cVar3 != '/')) ||
           ((local_48.c_str[__n - 2] != '\\' && (local_48.c_str[__n - 2] != '/'))))
        goto LAB_00107e08;
      }
      cVar3 = local_48.c_str[uVar8 - 1];
      __n = uVar8;
LAB_00107e08:
      lVar7 = lVar7 + (ulong)local_60.size;
      prealloc_size = (cVar3 != '\\' && cVar3 != '/') + __n + lVar7;
      mcu8str_create(__return_storage_ptr__,prealloc_size);
      pcVar2 = __return_storage_ptr__->c_str;
      memcpy(pcVar2,local_48.c_str,__n);
      if ((cVar3 != '/') && (cVar3 != '\\')) {
        pcVar2[__n] = '/';
        __n = __n + 1;
      }
      memcpy(pcVar2 + __n,local_60.c_str,lVar7 + 1);
      __return_storage_ptr__->size = (uint)prealloc_size;
      goto LAB_00107d9f;
    }
    str = &local_60;
  }
  mcu8str_copy(__return_storage_ptr__,str);
LAB_00107d9f:
  mctools_pathseps_platform(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

mcu8str mctools_path_join( const mcu8str* p1raw, const mcu8str* p2raw )
  {
    //In general try to mimic os.path.path from Python, although we do not
    //require a drive letter on windows to be considered an absolute path, so we
    //might have slight changes in some weird cases.

    mcu8str p1 = mctools_impl_view_no_winnamespace(p1raw);
    mcu8str p2 = mctools_impl_view_no_winnamespace(p2raw);

#ifdef MC_IS_WINDOWS
    const char native_sep = '\\';
#else
    const char native_sep = '/';
#endif

    if ( p2.size == 0 ) {
      //Simply copy p1, but ensure it ends in a separator:
      if ( !p1.size )
        return mcu8str_create_empty();//special case: join("","")->""
      char lastchar = p1.c_str[p1.size-1];
      if ( lastchar == '\\' || lastchar == '/' ) {
        mcu8str p1copy = mcu8str_copy( &p1 );
        mctools_pathseps_platform(&p1copy);
        return p1copy;
      }
      mcu8str res = mcu8str_create( p1.size + 1 );
      mcu8str_append( &res, &p1 );
      res.c_str[res.size] = native_sep;
      ++( res.size );
      res.c_str[res.size] = '\0';
      mctools_pathseps_platform(&res);
      return res;
    }

    char drive_letter1 = p1.size >= 2 ? mctools_drive_letter(&p1) : 0;
    char drive_letter2 = p2.size >= 2 ? mctools_drive_letter(&p2) : 0;
    if ( p1.size == 0 || mctools_path_is_absolute(&p2) ) {
      //p1 is empty or p2 is an absolute path, so simply discard p1 (like
      //Pythons os.path.join does in this case). However, if there is a drive
      //letter in p1 and not in p2, we use that drive letter:
      if ( drive_letter1 && !drive_letter2 ) {
        mcu8str res = mcu8str_create( p2.size + 2 );
        res.c_str[0] = drive_letter1;
        res.c_str[1] = ':';
        res.c_str[2] = '\0';
        res.size = 2;
        mcu8str_append( &res, &p2 );
        mctools_pathseps_platform(&res);
        return res;
      } else {
        mcu8str p2copy = mcu8str_copy( &p2 );
        mctools_pathseps_platform(&p2copy);
        return p2copy;
      }
    }

    if ( drive_letter2 && drive_letter1 != drive_letter2 ) {
      //p2 has a drive letter and p1 has a different drive letter => simply
      //return p2.
      mcu8str p2copy = mcu8str_copy( &p2 );
      mctools_pathseps_platform(&p2copy);
      return p2copy;
    }

    //Neither p1 or p2 are empty here, so we can simply join them. However, if
    //there is a common drive letter or repeated slashes at the end of p1, we do
    //not repeat them needlessley.

    //Selected ranges:
    mcu8str_size_t iB1 = 0;
    mcu8str_size_t iE1 = p1.size;
    mcu8str_size_t iB2 = 0;
    mcu8str_size_t iE2 = p2.size;

    if ( drive_letter1 && drive_letter1 == drive_letter2 )
      iB2 += 2;//skip common drive letter from p2

    //Strip repeated trailing slashes down to one trailing slash:
    mcu8str_size_t minlen1 = ( drive_letter1 ? 3 : 1 );
    while ( iE1-iB1 > minlen1
            && ( p1.c_str[iE1-1]=='/' || p1.c_str[iE1-1]=='\\' )
            && ( p1.c_str[iE1-2]=='/' || p1.c_str[iE1-2]=='\\' ) )
      --iE1;

    mcu8str_size_t needs_slash = ( ( p1.c_str[iE1-1]=='/'
                                   || p1.c_str[iE1-1]=='\\' ) ? 0 : 1 );

    mcu8str_size_t s1 = iE1-iB1;
    mcu8str_size_t s2 = iE2-iB2;
    mcu8str_size_t newsize = s1 + s2 + needs_slash;
    mcu8str res =  mcu8str_create( newsize  );
    STDNS memcpy( res.c_str, p1.c_str, s1 );
    mcu8str_size_t used = s1;
    if ( needs_slash ) {
      res.c_str[used] = native_sep;
      ++used;
    }
    STDNS memcpy( res.c_str + used, p2.c_str, s2+1 );//+1 to include null char
    res.size = (unsigned)newsize;//cast ok due to mcu8str_create
    mctools_pathseps_platform(&res);
    return res;
  }